

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cc
# Opt level: O0

void __thiscall muduo::ThreadPool::start(ThreadPool *this,int numThreads)

{
  bool bVar1;
  _Bind<void_(muduo::ThreadPool::*(muduo::ThreadPool_*))()> *__f;
  int in_ESI;
  function<void_()> *in_RDI;
  char id [32];
  int i;
  Thread *in_stack_00000f60;
  function<void_()> *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff40;
  ThreadFunc *in_stack_ffffffffffffff48;
  Thread *in_stack_ffffffffffffff50;
  char local_38 [40];
  int local_10;
  int local_c;
  
  *(undefined1 *)&in_RDI[10]._M_invoker = 1;
  local_c = in_ESI;
  std::
  vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
  ::reserve((vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
             *)in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
  for (local_10 = 0; local_10 < local_c; local_10 = local_10 + 1) {
    snprintf(local_38,0x20,"%d",(ulong)(local_10 + 1));
    in_stack_ffffffffffffff20 =
         (function<void_()> *)((long)&in_RDI[7].super__Function_base._M_functor + 8);
    __f = (_Bind<void_(muduo::ThreadPool::*(muduo::ThreadPool_*))()> *)operator_new(0xd0);
    std::bind<void(muduo::ThreadPool::*)(),muduo::ThreadPool*>
              ((offset_in_ThreadPool_to_subr *)__f,(ThreadPool **)in_stack_ffffffffffffff20);
    std::function<void()>::
    function<std::_Bind<void(muduo::ThreadPool::*(muduo::ThreadPool*))()>,void>(in_RDI,__f);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40);
    Thread::Thread(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::
    vector<std::unique_ptr<muduo::Thread,std::default_delete<muduo::Thread>>,std::allocator<std::unique_ptr<muduo::Thread,std::default_delete<muduo::Thread>>>>
    ::emplace_back<muduo::Thread*>
              ((vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
                *)in_RDI,(Thread **)__f);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
    std::function<void_()>::~function((function<void_()> *)0x151157);
    std::
    vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
    ::operator[]((vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
                  *)((long)&in_RDI[7].super__Function_base._M_functor + 8),(long)local_10);
    std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>::operator->
              ((unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_> *)0x151178);
    Thread::start(in_stack_00000f60);
  }
  if ((local_c == 0) &&
     (bVar1 = std::function::operator_cast_to_bool(in_stack_ffffffffffffff20), bVar1)) {
    std::function<void_()>::operator()(in_stack_ffffffffffffff20);
  }
  return;
}

Assistant:

void ThreadPool::start(int numThreads)
{
  assert(threads_.empty());
  running_ = true;
  threads_.reserve(numThreads);
  for (int i = 0; i < numThreads; ++i)
  {
    char id[32];
    snprintf(id, sizeof id, "%d", i+1);
    threads_.emplace_back(new muduo::Thread(
          std::bind(&ThreadPool::runInThread, this), name_+id));
    threads_[i]->start();
  }
  if (numThreads == 0 && threadInitCallback_)
  {
    threadInitCallback_();
  }
}